

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBOCache.cpp
# Opt level: O2

GLenum Diligent::GetFramebufferAttachmentPoint(TEXTURE_FORMAT Format)

{
  GLenum GVar1;
  TextureFormatAttribs *pTVar2;
  GLenum GVar3;
  
  pTVar2 = GetTextureFormatAttribs(Format);
  GVar3 = 0x8ce0;
  if (pTVar2->ComponentType == COMPONENT_TYPE_DEPTH_STENCIL) {
    GVar3 = 0x821a;
  }
  GVar1 = 0x8d00;
  if (pTVar2->ComponentType != COMPONENT_TYPE_DEPTH) {
    GVar1 = GVar3;
  }
  return GVar1;
}

Assistant:

inline GLenum GetFramebufferAttachmentPoint(TEXTURE_FORMAT Format)
{
    const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(Format);
    switch (FmtAttribs.ComponentType)
    {
        case COMPONENT_TYPE_DEPTH:
            return GL_DEPTH_ATTACHMENT;
        case COMPONENT_TYPE_DEPTH_STENCIL:
            return GL_DEPTH_STENCIL_ATTACHMENT;
        default:
            return GL_COLOR_ATTACHMENT0;
    }
}